

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

int If_Dec7DeriveCount3(word *t,int *pCof0,int *pCof1)

{
  undefined4 local_30;
  undefined4 local_2c;
  int Mask;
  int i;
  uchar *pTruth;
  int *pCof1_local;
  int *pCof0_local;
  word *t_local;
  
  local_30 = 0;
  *pCof0 = (uint)(byte)*t;
  *pCof1 = (uint)(byte)*t;
  for (local_2c = 1; local_2c < 0x10; local_2c = local_2c + 1) {
    if (*pCof0 != (uint)*(byte *)((long)t + (long)local_2c)) {
      *pCof1 = (uint)*(byte *)((long)t + (long)local_2c);
      local_30 = 1 << ((byte)local_2c & 0x1f) | local_30;
    }
  }
  return local_30;
}

Assistant:

static inline int If_Dec7DeriveCount3( word t[2], int * pCof0, int * pCof1 )
{
    unsigned char * pTruth = (unsigned char *)t;
    int i, Mask = 0;
	*pCof0 = pTruth[0];
	*pCof1 = pTruth[0];
    for ( i = 1; i < 16; i++ )
		if ( *pCof0 != pTruth[i] )
		{
			*pCof1 = pTruth[i];
			Mask |= (1 << i);
		}
	return Mask;
}